

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::RuleBasedNumberFormat
          (RuleBasedNumberFormat *this,URBNFRuleSetTag tag,Locale *alocale,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  UResourceBundle *resourceBundle;
  char *actual;
  UResourceBundle *resB;
  UParseError perror;
  undefined1 local_a8 [8];
  UnicodeString desc;
  UResourceBundle *ruleSets;
  UResourceBundle *rbnfRules;
  UResourceBundle *nfrb;
  LocalizationInfo *locinfo;
  char *fmt_tag;
  char *rules_tag;
  UErrorCode *status_local;
  Locale *alocale_local;
  URBNFRuleSetTag tag_local;
  RuleBasedNumberFormat *this_local;
  
  NumberFormat::NumberFormat(&this->super_NumberFormat);
  (this->super_NumberFormat).super_Format.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedNumberFormat_004ab3b0;
  this->fRuleSets = (NFRuleSet **)0x0;
  this->ruleSetDescriptions = (UnicodeString *)0x0;
  this->numRuleSets = 0;
  this->defaultRuleSet = (NFRuleSet *)0x0;
  Locale::Locale(&this->locale,alocale);
  this->collator = (RuleBasedCollator *)0x0;
  this->decimalFormatSymbols = (DecimalFormatSymbols *)0x0;
  this->defaultInfinityRule = (NFRule *)0x0;
  this->defaultNaNRule = (NFRule *)0x0;
  this->fRoundingMode = kRoundUnnecessary;
  this->lenient = '\0';
  this->lenientParseRules = (UnicodeString *)0x0;
  this->localizations = (LocalizationInfo *)0x0;
  UnicodeString::UnicodeString(&this->originalDescription);
  this->capitalizationInfoSet = '\0';
  this->capitalizationForUIListMenu = '\0';
  this->capitalizationForStandAlone = '\0';
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    switch(tag) {
    case URBNF_SPELLOUT:
      locinfo = (LocalizationInfo *)anon_var_dwarf_9c752;
      break;
    case URBNF_ORDINAL:
      locinfo = (LocalizationInfo *)anon_var_dwarf_9c769;
      break;
    case URBNF_DURATION:
      locinfo = (LocalizationInfo *)anon_var_dwarf_9c780;
      break;
    case URBNF_NUMBERING_SYSTEM:
      locinfo = (LocalizationInfo *)anon_var_dwarf_9c78b;
      break;
    default:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
    pcVar2 = Locale::getName(&this->locale);
    resourceBundle = ures_open_63("icudt63l-rbnf",pcVar2,status);
    UVar1 = ::U_SUCCESS(*status);
    if (UVar1 != '\0') {
      pcVar2 = ures_getLocaleByType_63(resourceBundle,ULOC_VALID_LOCALE,status);
      actual = ures_getLocaleByType_63(resourceBundle,ULOC_ACTUAL_LOCALE,status);
      Format::setLocaleIDs((Format *)this,pcVar2,actual);
      resB = ures_getByKeyWithFallback_63(resourceBundle,"RBNFRules",(UResourceBundle *)0x0,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        ures_close_63(resourceBundle);
      }
      desc.fUnion._48_8_ =
           ures_getByKeyWithFallback_63(resB,(char *)locinfo,(UResourceBundle *)0x0,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 != '\0') {
        ures_close_63(resB);
        ures_close_63(resourceBundle);
        return;
      }
      UnicodeString::UnicodeString((UnicodeString *)local_a8);
      while (UVar1 = ures_hasNext_63((UResourceBundle *)desc.fUnion._48_8_), UVar1 != '\0') {
        ures_getNextUnicodeString
                  ((UnicodeString *)(perror.postContext + 0xc),(UResourceBundle *)desc.fUnion._48_8_
                   ,(char **)0x0,status);
        UnicodeString::append((UnicodeString *)local_a8,(UnicodeString *)(perror.postContext + 0xc))
        ;
        UnicodeString::~UnicodeString((UnicodeString *)(perror.postContext + 0xc));
      }
      init(this,(EVP_PKEY_CTX *)local_a8);
      ures_close_63((UResourceBundle *)desc.fUnion._48_8_);
      ures_close_63(resB);
      UnicodeString::~UnicodeString((UnicodeString *)local_a8);
    }
    ures_close_63(resourceBundle);
  }
  return;
}

Assistant:

RuleBasedNumberFormat::RuleBasedNumberFormat(URBNFRuleSetTag tag, const Locale& alocale, UErrorCode& status)
  : fRuleSets(NULL)
  , ruleSetDescriptions(NULL)
  , numRuleSets(0)
  , defaultRuleSet(NULL)
  , locale(alocale)
  , collator(NULL)
  , decimalFormatSymbols(NULL)
  , defaultInfinityRule(NULL)
  , defaultNaNRule(NULL)
  , fRoundingMode(DecimalFormat::ERoundingMode::kRoundUnnecessary)
  , lenient(FALSE)
  , lenientParseRules(NULL)
  , localizations(NULL)
  , capitalizationInfoSet(FALSE)
  , capitalizationForUIListMenu(FALSE)
  , capitalizationForStandAlone(FALSE)
  , capitalizationBrkIter(NULL)
{
    if (U_FAILURE(status)) {
        return;
    }

    const char* rules_tag = "RBNFRules";
    const char* fmt_tag = "";
    switch (tag) {
    case URBNF_SPELLOUT: fmt_tag = "SpelloutRules"; break;
    case URBNF_ORDINAL: fmt_tag = "OrdinalRules"; break;
    case URBNF_DURATION: fmt_tag = "DurationRules"; break;
    case URBNF_NUMBERING_SYSTEM: fmt_tag = "NumberingSystemRules"; break;
    default: status = U_ILLEGAL_ARGUMENT_ERROR; return;
    }

    // TODO: read localization info from resource
    LocalizationInfo* locinfo = NULL;

    UResourceBundle* nfrb = ures_open(U_ICUDATA_RBNF, locale.getName(), &status);
    if (U_SUCCESS(status)) {
        setLocaleIDs(ures_getLocaleByType(nfrb, ULOC_VALID_LOCALE, &status),
                     ures_getLocaleByType(nfrb, ULOC_ACTUAL_LOCALE, &status));

        UResourceBundle* rbnfRules = ures_getByKeyWithFallback(nfrb, rules_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(nfrb);
        }
        UResourceBundle* ruleSets = ures_getByKeyWithFallback(rbnfRules, fmt_tag, NULL, &status);
        if (U_FAILURE(status)) {
            ures_close(rbnfRules);
            ures_close(nfrb);
            return;
        }

        UnicodeString desc;
        while (ures_hasNext(ruleSets)) {
           desc.append(ures_getNextUnicodeString(ruleSets,NULL,&status));
        }
        UParseError perror;

        init(desc, locinfo, perror, status);

        ures_close(ruleSets);
        ures_close(rbnfRules);
    }
    ures_close(nfrb);
}